

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borders_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_e4c0dc::BordersTestLarge_TestEncodeHighBitrate_Test::
~BordersTestLarge_TestEncodeHighBitrate_Test(BordersTestLarge_TestEncodeHighBitrate_Test *this)

{
  BordersTestLarge::~BordersTestLarge(&this->super_BordersTestLarge);
  operator_delete(this);
  return;
}

Assistant:

TEST_P(BordersTestLarge, TestEncodeHighBitrate) {
  // Validate that this non multiple of 64 wide clip encodes and decodes
  // without a mismatch when passing in a very low max q.  This pushes
  // the encoder to producing lots of big partitions which will likely
  // extend into the border and test the border condition.
  cfg_.g_lag_in_frames = 25;
  cfg_.rc_2pass_vbr_minsection_pct = 5;
  cfg_.rc_2pass_vbr_maxsection_pct = 2000;
  cfg_.rc_target_bitrate = 2000;
  cfg_.rc_max_quantizer = 10;

  ::libaom_test::I420VideoSource video("hantro_odd.yuv", 208, 144, 30, 1, 0,
                                       10);

  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}